

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vfloat<4> vVar9;
  byte bVar10;
  BVH *bvh;
  void *pvVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  vbool<4> vVar20;
  char cVar21;
  bool bVar22;
  uint uVar23;
  undefined4 uVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  NodeRef root;
  size_t sVar29;
  size_t sVar30;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar31;
  NodeRef *pNVar32;
  undefined1 in_ZMM0 [64];
  vint4 ai_3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  vint4 ai_1;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 ai;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 bi_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar69;
  float fVar70;
  vint4 bi_3;
  float fVar71;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 ai_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vfloat4 a0;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar86;
  float fVar87;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar88;
  float fVar89;
  float fVar94;
  float fVar95;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  undefined1 auVar93 [64];
  float fVar97;
  float fVar100;
  float fVar101;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar19 = mm_lookupmask_ps._8_8_;
  uVar18 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar30 = (bvh->root).ptr;
  if (sVar30 != 8) {
    auVar41 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar50 = vpcmpeqd_avx(auVar41,(undefined1  [16])valid_i->field_0);
    auVar41 = *(undefined1 (*) [16])(ray + 0x80);
    auVar33 = ZEXT816(0) << 0x40;
    auVar45 = vcmpps_avx(auVar41,auVar33,5);
    auVar45 = vandps_avx(auVar45,auVar50);
    uVar26 = vmovmskps_avx(auVar45);
    if (uVar26 != 0) {
      uVar27 = (ulong)(uVar26 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar60._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar60._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar60._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar60._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar50 = vrsqrtps_avx(auVar60);
      fVar64 = auVar50._0_4_;
      fVar69 = auVar50._4_4_;
      fVar70 = auVar50._8_4_;
      fVar71 = auVar50._12_4_;
      pre.depth_scale.field_0.v[0] = fVar64 * 1.5 + fVar64 * fVar64 * fVar64 * auVar60._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] = fVar69 * 1.5 + fVar69 * fVar69 * fVar69 * auVar60._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar70 * 1.5 + fVar70 * fVar70 * fVar70 * auVar60._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar71 * 1.5 + fVar71 * fVar71 * fVar71 * auVar60._12_4_ * -0.5
      ;
      auVar50._8_4_ = 0x80000000;
      auVar50._0_8_ = 0x8000000080000000;
      auVar50._12_4_ = 0x80000000;
      do {
        lVar28 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
          }
        }
        auVar60 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar28 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar28 * 4 + 0x50)),0x1c);
        auVar60 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(ray + lVar28 * 4 + 0x60)),0x28);
        fVar64 = *(float *)((long)pre.ray_space + lVar28 * 4 + -0x10);
        auVar75._0_4_ = auVar60._0_4_ * fVar64;
        auVar75._4_4_ = auVar60._4_4_ * fVar64;
        auVar75._8_4_ = auVar60._8_4_ * fVar64;
        auVar75._12_4_ = auVar60._12_4_ * fVar64;
        auVar72 = vshufpd_avx(auVar75,auVar75,1);
        auVar60 = vmovshdup_avx(auVar75);
        auVar81._0_4_ = auVar60._0_4_ ^ 0x80000000;
        auVar60 = vunpckhps_avx(auVar75,auVar33);
        auVar81._4_12_ = ZEXT812(0) << 0x20;
        auVar79 = vshufps_avx(auVar60,auVar81,0x41);
        auVar78._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
        auVar78._8_8_ = auVar72._8_8_ ^ auVar50._8_8_;
        auVar78 = vinsertps_avx(auVar78,auVar75,0x2a);
        auVar60 = vdpps_avx(auVar79,auVar79,0x7f);
        auVar72 = vdpps_avx(auVar78,auVar78,0x7f);
        auVar60 = vcmpps_avx(auVar72,auVar60,1);
        auVar60 = vshufps_avx(auVar60,auVar60,0);
        auVar60 = vblendvps_avx(auVar78,auVar79,auVar60);
        auVar72 = vdpps_avx(auVar60,auVar60,0x7f);
        auVar78 = vrsqrtss_avx(auVar72,auVar72);
        fVar69 = auVar78._0_4_;
        auVar72 = ZEXT416((uint)(fVar69 * 1.5 - auVar72._0_4_ * 0.5 * fVar69 * fVar69 * fVar69));
        auVar72 = vshufps_avx(auVar72,auVar72,0);
        auVar79._0_4_ = auVar60._0_4_ * auVar72._0_4_;
        auVar79._4_4_ = auVar60._4_4_ * auVar72._4_4_;
        auVar79._8_4_ = auVar60._8_4_ * auVar72._8_4_;
        auVar79._12_4_ = auVar60._12_4_ * auVar72._12_4_;
        auVar60 = vshufps_avx(auVar79,auVar79,0xc9);
        auVar72 = vshufps_avx(auVar75,auVar75,0xc9);
        auVar90._0_4_ = auVar72._0_4_ * auVar79._0_4_;
        auVar90._4_4_ = auVar72._4_4_ * auVar79._4_4_;
        auVar90._8_4_ = auVar72._8_4_ * auVar79._8_4_;
        auVar90._12_4_ = auVar72._12_4_ * auVar79._12_4_;
        auVar82._0_4_ = auVar75._0_4_ * auVar60._0_4_;
        auVar82._4_4_ = auVar75._4_4_ * auVar60._4_4_;
        auVar82._8_4_ = auVar75._8_4_ * auVar60._8_4_;
        auVar82._12_4_ = auVar75._12_4_ * auVar60._12_4_;
        auVar60 = vsubps_avx(auVar82,auVar90);
        auVar78 = vshufps_avx(auVar60,auVar60,0xc9);
        auVar60 = vdpps_avx(auVar78,auVar78,0x7f);
        auVar72 = vrsqrtss_avx(auVar60,auVar60);
        fVar69 = auVar72._0_4_;
        auVar60 = ZEXT416((uint)(fVar69 * 1.5 - auVar60._0_4_ * 0.5 * fVar69 * fVar69 * fVar69));
        auVar60 = vshufps_avx(auVar60,auVar60,0);
        auVar83._0_4_ = auVar60._0_4_ * auVar78._0_4_;
        auVar83._4_4_ = auVar60._4_4_ * auVar78._4_4_;
        auVar83._8_4_ = auVar60._8_4_ * auVar78._8_4_;
        auVar83._12_4_ = auVar60._12_4_ * auVar78._12_4_;
        auVar72._0_4_ = auVar75._0_4_ * fVar64;
        auVar72._4_4_ = auVar75._4_4_ * fVar64;
        auVar72._8_4_ = auVar75._8_4_ * fVar64;
        auVar72._12_4_ = auVar75._12_4_ * fVar64;
        auVar78 = vunpcklps_avx(auVar79,auVar72);
        auVar60 = vunpckhps_avx(auVar79,auVar72);
        auVar79 = vunpcklps_avx(auVar83,auVar33);
        auVar72 = vunpckhps_avx(auVar83,auVar33);
        aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar60,auVar72);
        aVar14 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar78,auVar79);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar78,auVar79);
        pre.ray_space[lVar28].vx.field_0 = aVar14;
        pre.ray_space[lVar28].vy.field_0 = aVar12;
        pre.ray_space[lVar28].vz.field_0 = aVar13;
        uVar27 = uVar27 & uVar27 - 1;
      } while (uVar27 != 0);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      tray.org.field_0._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      tray.org.field_0._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      tray.org.field_0._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      tray.org.field_0._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      tray.org.field_0._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      tray.org.field_0._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      tray.org.field_0._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      auVar65._8_4_ = 0x7fffffff;
      auVar65._0_8_ = 0x7fffffff7fffffff;
      auVar65._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar65);
      auVar73._8_4_ = 0x219392ef;
      auVar73._0_8_ = 0x219392ef219392ef;
      auVar73._12_4_ = 0x219392ef;
      auVar33 = vcmpps_avx(auVar50,auVar73,1);
      auVar76._8_4_ = 0x3f800000;
      auVar76._0_8_ = 0x3f8000003f800000;
      auVar76._12_4_ = 0x3f800000;
      auVar72 = vdivps_avx(auVar76,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar50 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar65);
      auVar60 = vcmpps_avx(auVar50,auVar73,1);
      auVar78 = vdivps_avx(auVar76,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar50 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar65);
      auVar50 = vcmpps_avx(auVar50,auVar73,1);
      auVar79 = vdivps_avx(auVar76,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar74._8_4_ = 0x5d5e0b6b;
      auVar74._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar74._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar72,auVar74,auVar33);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar78,auVar74,auVar60);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar79,auVar74,auVar50);
      auVar33 = ZEXT816(0) << 0x20;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar33,1);
      auVar61._8_4_ = 0x10;
      auVar61._0_8_ = 0x1000000010;
      auVar61._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar50,auVar61);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar33,5);
      auVar62._8_4_ = 0x20;
      auVar62._0_8_ = 0x2000000020;
      auVar62._12_4_ = 0x20;
      auVar66._8_4_ = 0x30;
      auVar66._0_8_ = 0x3000000030;
      auVar66._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar66,auVar62,auVar50);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar33,5);
      auVar47._8_4_ = 0x40;
      auVar47._0_8_ = 0x4000000040;
      auVar47._12_4_ = 0x40;
      auVar54._8_4_ = 0x50;
      auVar54._0_8_ = 0x5000000050;
      auVar54._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar54,auVar47,auVar50);
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar33);
      auVar41 = vmaxps_avx(auVar41,auVar33);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar93 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar50,auVar45);
      auVar33._8_4_ = 0xff800000;
      auVar33._0_8_ = 0xff800000ff800000;
      auVar33._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar33,auVar41,auVar45);
      auVar41 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0.i[1] = auVar45._4_4_ ^ auVar41._4_4_;
      terminated.field_0.i[0] = auVar45._0_4_ ^ auVar41._0_4_;
      terminated.field_0.i[2] = auVar45._8_4_ ^ auVar41._8_4_;
      terminated.field_0.i[3] = auVar45._12_4_ ^ auVar41._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar26 = 3;
      }
      else {
        uVar26 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar32 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar31 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar30;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00303dd5:
      do {
        do {
          root.ptr = pNVar32[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0030441f;
          pNVar32 = pNVar32 + -1;
          paVar31 = paVar31 + -1;
          vVar9.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar31->v;
          auVar46 = ZEXT1664((undefined1  [16])vVar9.field_0);
          auVar41 = vcmpps_avx((undefined1  [16])vVar9.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar23 = vmovmskps_avx(auVar41);
        } while (uVar23 == 0);
        uVar27 = (ulong)(uVar23 & 0xff);
        uVar23 = POPCOUNT(uVar23 & 0xff);
        if (uVar26 < uVar23) {
LAB_00303e13:
          do {
            vVar20.field_0 = terminated.field_0;
            iVar25 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0030441f;
              auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar46._0_16_,6);
              if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar41[0xf] < '\0') {
                bVar10 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar11 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar19;
                valid_o.field_0._0_8_ = uVar18;
                uVar23 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                if ((uVar23 ^ 0xf) != 0) {
                  uVar27 = (ulong)((uVar23 ^ 0xf) & 0xff);
                  do {
                    lVar28 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                      }
                    }
                    cVar21 = (**(code **)((long)pvVar11 + (ulong)bVar10 * 0x40 + 0x18))
                                       (&pre,ray,lVar28,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar21 != '\0') {
                      valid_o.field_0.i[lVar28] = -1;
                    }
                    uVar27 = uVar27 & uVar27 - 1;
                  } while (uVar27 != 0);
                  auVar93 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])valid_o.field_0,(undefined1  [16])vVar20.field_0);
                auVar41 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar41[0xf]) goto LAB_0030441f;
                auVar53._8_4_ = 0xff800000;
                auVar53._0_8_ = 0xff800000ff800000;
                auVar53._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar53,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_00303dd5;
            }
            uVar27 = root.ptr & 0xfffffffffffffff0;
            auVar41 = auVar93._0_16_;
            lVar28 = 0x1c;
            sVar30 = 8;
            do {
              sVar29 = *(size_t *)((uVar27 - 0xe0) + lVar28 * 8);
              if (sVar29 == 8) {
                auVar46 = ZEXT1664(auVar41);
                sVar29 = sVar30;
                break;
              }
              if ((root.ptr & 7) == 0) {
                uVar24 = *(undefined4 *)((root.ptr - 0x50) + lVar28 * 4);
                auVar34._4_4_ = uVar24;
                auVar34._0_4_ = uVar24;
                auVar34._8_4_ = uVar24;
                auVar34._12_4_ = uVar24;
                auVar15._4_4_ = tray.org.field_0._4_4_;
                auVar15._0_4_ = tray.org.field_0._0_4_;
                auVar15._8_4_ = tray.org.field_0._8_4_;
                auVar15._12_4_ = tray.org.field_0._12_4_;
                auVar16._4_4_ = tray.org.field_0._20_4_;
                auVar16._0_4_ = tray.org.field_0._16_4_;
                auVar16._8_4_ = tray.org.field_0._24_4_;
                auVar16._12_4_ = tray.org.field_0._28_4_;
                auVar17._4_4_ = tray.org.field_0._36_4_;
                auVar17._0_4_ = tray.org.field_0._32_4_;
                auVar17._8_4_ = tray.org.field_0._40_4_;
                auVar17._12_4_ = tray.org.field_0._44_4_;
                auVar50 = vsubps_avx(auVar34,auVar15);
                auVar67._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar50._0_4_;
                auVar67._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar50._4_4_;
                auVar67._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar50._8_4_;
                auVar67._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar50._12_4_;
                uVar24 = *(undefined4 *)((root.ptr - 0x30) + lVar28 * 4);
                auVar35._4_4_ = uVar24;
                auVar35._0_4_ = uVar24;
                auVar35._8_4_ = uVar24;
                auVar35._12_4_ = uVar24;
                auVar50 = vsubps_avx(auVar35,auVar16);
                auVar77._0_4_ = tray.rdir.field_0._16_4_ * auVar50._0_4_;
                auVar77._4_4_ = tray.rdir.field_0._20_4_ * auVar50._4_4_;
                auVar77._8_4_ = tray.rdir.field_0._24_4_ * auVar50._8_4_;
                auVar77._12_4_ = tray.rdir.field_0._28_4_ * auVar50._12_4_;
                uVar24 = *(undefined4 *)((root.ptr - 0x10) + lVar28 * 4);
                auVar36._4_4_ = uVar24;
                auVar36._0_4_ = uVar24;
                auVar36._8_4_ = uVar24;
                auVar36._12_4_ = uVar24;
                auVar50 = vsubps_avx(auVar36,auVar17);
                auVar84._0_4_ = tray.rdir.field_0._32_4_ * auVar50._0_4_;
                auVar84._4_4_ = tray.rdir.field_0._36_4_ * auVar50._4_4_;
                auVar84._8_4_ = tray.rdir.field_0._40_4_ * auVar50._8_4_;
                auVar84._12_4_ = tray.rdir.field_0._44_4_ * auVar50._12_4_;
                uVar24 = *(undefined4 *)((root.ptr - 0x40) + lVar28 * 4);
                auVar37._4_4_ = uVar24;
                auVar37._0_4_ = uVar24;
                auVar37._8_4_ = uVar24;
                auVar37._12_4_ = uVar24;
                auVar50 = vsubps_avx(auVar37,auVar15);
                auVar48._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar50._0_4_;
                auVar48._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar50._4_4_;
                auVar48._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar50._8_4_;
                auVar48._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar50._12_4_;
                uVar24 = *(undefined4 *)((root.ptr - 0x20) + lVar28 * 4);
                auVar38._4_4_ = uVar24;
                auVar38._0_4_ = uVar24;
                auVar38._8_4_ = uVar24;
                auVar38._12_4_ = uVar24;
                auVar50 = vsubps_avx(auVar38,auVar16);
                auVar55._0_4_ = tray.rdir.field_0._16_4_ * auVar50._0_4_;
                auVar55._4_4_ = tray.rdir.field_0._20_4_ * auVar50._4_4_;
                auVar55._8_4_ = tray.rdir.field_0._24_4_ * auVar50._8_4_;
                auVar55._12_4_ = tray.rdir.field_0._28_4_ * auVar50._12_4_;
                uVar24 = *(undefined4 *)(root.ptr + lVar28 * 4);
                auVar39._4_4_ = uVar24;
                auVar39._0_4_ = uVar24;
                auVar39._8_4_ = uVar24;
                auVar39._12_4_ = uVar24;
                auVar50 = vsubps_avx(auVar39,auVar17);
                auVar58._0_4_ = tray.rdir.field_0._32_4_ * auVar50._0_4_;
                auVar58._4_4_ = tray.rdir.field_0._36_4_ * auVar50._4_4_;
                auVar58._8_4_ = tray.rdir.field_0._40_4_ * auVar50._8_4_;
                auVar58._12_4_ = tray.rdir.field_0._44_4_ * auVar50._12_4_;
                auVar50 = vminps_avx(auVar67,auVar48);
                auVar33 = vminps_avx(auVar77,auVar55);
                auVar50 = vmaxps_avx(auVar50,auVar33);
                auVar33 = vminps_avx(auVar84,auVar58);
                auVar50 = vmaxps_avx(auVar50,auVar33);
                auVar40._0_4_ = auVar50._0_4_ * 0.99999964;
                auVar40._4_4_ = auVar50._4_4_ * 0.99999964;
                auVar40._8_4_ = auVar50._8_4_ * 0.99999964;
                auVar40._12_4_ = auVar50._12_4_ * 0.99999964;
                auVar50 = vmaxps_avx(auVar67,auVar48);
                auVar33 = vmaxps_avx(auVar77,auVar55);
                auVar33 = vminps_avx(auVar50,auVar33);
                auVar50 = vmaxps_avx(auVar84,auVar58);
                auVar33 = vminps_avx(auVar33,auVar50);
                auVar50 = vmaxps_avx(auVar40,(undefined1  [16])tray.tnear.field_0);
                auVar49._0_4_ = auVar33._0_4_ * 1.0000004;
                auVar49._4_4_ = auVar33._4_4_ * 1.0000004;
                auVar49._8_4_ = auVar33._8_4_ * 1.0000004;
                auVar49._12_4_ = auVar33._12_4_ * 1.0000004;
                auVar33 = vminps_avx(auVar49,(undefined1  [16])tray.tfar.field_0);
              }
              else {
                fVar64 = *(float *)((uVar27 - 0x50) + lVar28 * 4);
                fVar69 = *(float *)((uVar27 - 0x40) + lVar28 * 4);
                fVar70 = *(float *)((uVar27 - 0x30) + lVar28 * 4);
                fVar71 = *(float *)((uVar27 - 0x20) + lVar28 * 4);
                fVar1 = *(float *)((uVar27 - 0x10) + lVar28 * 4);
                fVar2 = *(float *)(uVar27 + lVar28 * 4);
                fVar3 = *(float *)(uVar27 + 0x10 + lVar28 * 4);
                fVar4 = *(float *)(uVar27 + 0x20 + lVar28 * 4);
                fVar5 = *(float *)(uVar27 + 0x30 + lVar28 * 4);
                auVar91._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar64 +
                     (float)tray.dir.field_0._16_4_ * fVar71 +
                     fVar3 * (float)tray.dir.field_0._32_4_;
                auVar91._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar64 +
                     (float)tray.dir.field_0._20_4_ * fVar71 +
                     fVar3 * (float)tray.dir.field_0._36_4_;
                auVar91._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar64 +
                     (float)tray.dir.field_0._24_4_ * fVar71 +
                     fVar3 * (float)tray.dir.field_0._40_4_;
                auVar91._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar64 +
                     (float)tray.dir.field_0._28_4_ * fVar71 +
                     fVar3 * (float)tray.dir.field_0._44_4_;
                auVar98._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar69 +
                     (float)tray.dir.field_0._16_4_ * fVar1 + fVar4 * (float)tray.dir.field_0._32_4_
                ;
                auVar98._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar69 +
                     (float)tray.dir.field_0._20_4_ * fVar1 + fVar4 * (float)tray.dir.field_0._36_4_
                ;
                auVar98._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar69 +
                     (float)tray.dir.field_0._24_4_ * fVar1 + fVar4 * (float)tray.dir.field_0._40_4_
                ;
                auVar98._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar69 +
                     (float)tray.dir.field_0._28_4_ * fVar1 + fVar4 * (float)tray.dir.field_0._44_4_
                ;
                fVar6 = *(float *)(uVar27 + 0x40 + lVar28 * 4);
                auVar85._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar70 +
                     (float)tray.dir.field_0._16_4_ * fVar2 + (float)tray.dir.field_0._32_4_ * fVar5
                ;
                auVar85._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar70 +
                     (float)tray.dir.field_0._20_4_ * fVar2 + (float)tray.dir.field_0._36_4_ * fVar5
                ;
                auVar85._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar70 +
                     (float)tray.dir.field_0._24_4_ * fVar2 + (float)tray.dir.field_0._40_4_ * fVar5
                ;
                auVar85._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar70 +
                     (float)tray.dir.field_0._28_4_ * fVar2 + (float)tray.dir.field_0._44_4_ * fVar5
                ;
                auVar104._8_4_ = 0x7fffffff;
                auVar104._0_8_ = 0x7fffffff7fffffff;
                auVar104._12_4_ = 0x7fffffff;
                auVar50 = vandps_avx(auVar91,auVar104);
                auVar42._8_4_ = 0x219392ef;
                auVar42._0_8_ = 0x219392ef219392ef;
                auVar42._12_4_ = 0x219392ef;
                auVar50 = vcmpps_avx(auVar50,auVar42,1);
                auVar33 = vblendvps_avx(auVar91,auVar42,auVar50);
                auVar50 = vandps_avx(auVar98,auVar104);
                auVar50 = vcmpps_avx(auVar50,auVar42,1);
                auVar60 = vblendvps_avx(auVar98,auVar42,auVar50);
                auVar50 = vandps_avx(auVar85,auVar104);
                auVar50 = vcmpps_avx(auVar50,auVar42,1);
                auVar50 = vblendvps_avx(auVar85,auVar42,auVar50);
                auVar72 = vrcpps_avx(auVar33);
                fVar80 = auVar72._0_4_;
                auVar92._0_4_ = fVar80 * auVar33._0_4_;
                fVar86 = auVar72._4_4_;
                auVar92._4_4_ = fVar86 * auVar33._4_4_;
                fVar87 = auVar72._8_4_;
                auVar92._8_4_ = fVar87 * auVar33._8_4_;
                fVar88 = auVar72._12_4_;
                auVar92._12_4_ = fVar88 * auVar33._12_4_;
                auVar43._8_4_ = 0x3f800000;
                auVar43._0_8_ = 0x3f8000003f800000;
                auVar43._12_4_ = 0x3f800000;
                auVar33 = vsubps_avx(auVar43,auVar92);
                fVar80 = fVar80 + fVar80 * auVar33._0_4_;
                fVar86 = fVar86 + fVar86 * auVar33._4_4_;
                fVar87 = fVar87 + fVar87 * auVar33._8_4_;
                fVar88 = fVar88 + fVar88 * auVar33._12_4_;
                auVar33 = vrcpps_avx(auVar60);
                fVar89 = auVar33._0_4_;
                auVar99._0_4_ = fVar89 * auVar60._0_4_;
                fVar94 = auVar33._4_4_;
                auVar99._4_4_ = fVar94 * auVar60._4_4_;
                fVar95 = auVar33._8_4_;
                auVar99._8_4_ = fVar95 * auVar60._8_4_;
                fVar96 = auVar33._12_4_;
                auVar99._12_4_ = fVar96 * auVar60._12_4_;
                auVar33 = vsubps_avx(auVar43,auVar99);
                fVar89 = fVar89 + fVar89 * auVar33._0_4_;
                fVar94 = fVar94 + fVar94 * auVar33._4_4_;
                fVar95 = fVar95 + fVar95 * auVar33._8_4_;
                fVar96 = fVar96 + fVar96 * auVar33._12_4_;
                auVar33 = vrcpps_avx(auVar50);
                fVar97 = auVar33._0_4_;
                auVar103._0_4_ = fVar97 * auVar50._0_4_;
                fVar100 = auVar33._4_4_;
                auVar103._4_4_ = fVar100 * auVar50._4_4_;
                fVar101 = auVar33._8_4_;
                auVar103._8_4_ = fVar101 * auVar50._8_4_;
                fVar102 = auVar33._12_4_;
                auVar103._12_4_ = fVar102 * auVar50._12_4_;
                auVar50 = vsubps_avx(auVar43,auVar103);
                fVar97 = fVar97 + fVar97 * auVar50._0_4_;
                fVar100 = fVar100 + fVar100 * auVar50._4_4_;
                fVar101 = fVar101 + fVar101 * auVar50._8_4_;
                fVar102 = fVar102 + fVar102 * auVar50._12_4_;
                fVar7 = *(float *)(uVar27 + 0x50 + lVar28 * 4);
                fVar8 = *(float *)(uVar27 + 0x60 + lVar28 * 4);
                auVar57._0_4_ =
                     (fVar64 * (float)tray.org.field_0._0_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._32_4_ +
                     (float)tray.org.field_0._16_4_ * fVar71) * -fVar80;
                auVar57._4_4_ =
                     (fVar64 * (float)tray.org.field_0._4_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._36_4_ +
                     (float)tray.org.field_0._20_4_ * fVar71) * -fVar86;
                auVar57._8_4_ =
                     (fVar64 * (float)tray.org.field_0._8_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._40_4_ +
                     (float)tray.org.field_0._24_4_ * fVar71) * -fVar87;
                auVar57._12_4_ =
                     (fVar64 * (float)tray.org.field_0._12_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._44_4_ +
                     (float)tray.org.field_0._28_4_ * fVar71) * -fVar88;
                auVar51._0_4_ =
                     (fVar69 * (float)tray.org.field_0._0_4_ +
                     fVar7 + fVar4 * (float)tray.org.field_0._32_4_ +
                     (float)tray.org.field_0._16_4_ * fVar1) * -fVar89;
                auVar51._4_4_ =
                     (fVar69 * (float)tray.org.field_0._4_4_ +
                     fVar7 + fVar4 * (float)tray.org.field_0._36_4_ +
                     (float)tray.org.field_0._20_4_ * fVar1) * -fVar94;
                auVar51._8_4_ =
                     (fVar69 * (float)tray.org.field_0._8_4_ +
                     fVar7 + fVar4 * (float)tray.org.field_0._40_4_ +
                     (float)tray.org.field_0._24_4_ * fVar1) * -fVar95;
                auVar51._12_4_ =
                     (fVar69 * (float)tray.org.field_0._12_4_ +
                     fVar7 + fVar4 * (float)tray.org.field_0._44_4_ +
                     (float)tray.org.field_0._28_4_ * fVar1) * -fVar96;
                auVar44._0_4_ =
                     ((float)tray.org.field_0._0_4_ * fVar70 +
                     (float)tray.org.field_0._16_4_ * fVar2 +
                     fVar8 + (float)tray.org.field_0._32_4_ * fVar5) * -fVar97;
                auVar44._4_4_ =
                     ((float)tray.org.field_0._4_4_ * fVar70 +
                     (float)tray.org.field_0._20_4_ * fVar2 +
                     fVar8 + (float)tray.org.field_0._36_4_ * fVar5) * -fVar100;
                auVar44._8_4_ =
                     ((float)tray.org.field_0._8_4_ * fVar70 +
                     (float)tray.org.field_0._24_4_ * fVar2 +
                     fVar8 + (float)tray.org.field_0._40_4_ * fVar5) * -fVar101;
                auVar44._12_4_ =
                     ((float)tray.org.field_0._12_4_ * fVar70 +
                     (float)tray.org.field_0._28_4_ * fVar2 +
                     fVar8 + (float)tray.org.field_0._44_4_ * fVar5) * -fVar102;
                auVar59._0_4_ = fVar80 + auVar57._0_4_;
                auVar59._4_4_ = fVar86 + auVar57._4_4_;
                auVar59._8_4_ = fVar87 + auVar57._8_4_;
                auVar59._12_4_ = fVar88 + auVar57._12_4_;
                auVar63._0_4_ = fVar89 + auVar51._0_4_;
                auVar63._4_4_ = fVar94 + auVar51._4_4_;
                auVar63._8_4_ = fVar95 + auVar51._8_4_;
                auVar63._12_4_ = fVar96 + auVar51._12_4_;
                auVar93 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar68._0_4_ = fVar97 + auVar44._0_4_;
                auVar68._4_4_ = fVar100 + auVar44._4_4_;
                auVar68._8_4_ = fVar101 + auVar44._8_4_;
                auVar68._12_4_ = fVar102 + auVar44._12_4_;
                auVar50 = vpminsd_avx(auVar57,auVar59);
                auVar33 = vpminsd_avx(auVar51,auVar63);
                auVar50 = vpmaxsd_avx(auVar50,auVar33);
                auVar33 = vpminsd_avx(auVar44,auVar68);
                auVar50 = vpmaxsd_avx(auVar50,auVar33);
                auVar33 = vpmaxsd_avx(auVar57,auVar59);
                auVar60 = vpmaxsd_avx(auVar51,auVar63);
                auVar60 = vpminsd_avx(auVar33,auVar60);
                auVar33 = vpmaxsd_avx(auVar44,auVar68);
                auVar33 = vpminsd_avx(auVar60,auVar33);
                auVar40._0_4_ = auVar50._0_4_ * 0.99999964;
                auVar40._4_4_ = auVar50._4_4_ * 0.99999964;
                auVar40._8_4_ = auVar50._8_4_ * 0.99999964;
                auVar40._12_4_ = auVar50._12_4_ * 0.99999964;
                auVar50 = vpmaxsd_avx(auVar40,(undefined1  [16])tray.tnear.field_0);
                auVar52._0_4_ = auVar33._0_4_ * 1.0000004;
                auVar52._4_4_ = auVar33._4_4_ * 1.0000004;
                auVar52._8_4_ = auVar33._8_4_ * 1.0000004;
                auVar52._12_4_ = auVar33._12_4_ * 1.0000004;
                auVar33 = vpminsd_avx(auVar52,(undefined1  [16])tray.tfar.field_0);
              }
              auVar50 = vcmpps_avx(auVar50,auVar33,2);
              auVar56._8_8_ = 0x100000001;
              auVar56._0_8_ = 0x100000001;
              if ((auVar56 & auVar50) == (undefined1  [16])0x0) {
                auVar46 = ZEXT1664(auVar41);
                sVar29 = sVar30;
              }
              else {
                auVar50 = vpslld_avx(auVar50,0x1f);
                auVar50 = vblendvps_avx(auVar93._0_16_,auVar40,auVar50);
                auVar46 = ZEXT1664(auVar50);
                if (sVar30 != 8) {
                  pNVar32->ptr = sVar30;
                  pNVar32 = pNVar32 + 1;
                  *(undefined1 (*) [16])paVar31->v = auVar41;
                  paVar31 = paVar31 + 1;
                }
              }
              lVar28 = lVar28 + 1;
              auVar41 = auVar46._0_16_;
              sVar30 = sVar29;
            } while (lVar28 != 0x20);
            if (sVar29 == 8) goto LAB_00304210;
            auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar46._0_16_,6);
            uVar24 = vmovmskps_avx(auVar41);
            root.ptr = sVar29;
          } while ((byte)uVar26 < (byte)POPCOUNT(uVar24));
          pNVar32->ptr = sVar29;
          pNVar32 = pNVar32 + 1;
          *paVar31 = auVar46._0_16_;
          paVar31 = paVar31 + 1;
        }
        else {
          do {
            sVar30 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> sVar30 & 1) == 0; sVar30 = sVar30 + 1) {
              }
            }
            bVar22 = occluded1(This,bvh,root,sVar30,&pre,ray,&tray,context);
            if (bVar22) {
              terminated.field_0.i[sVar30] = -1;
            }
            uVar27 = uVar27 & uVar27 - 1;
          } while (uVar27 != 0);
          auVar41 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar25 = 3;
          if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar41[0xf] < '\0') {
            auVar41._8_4_ = 0xff800000;
            auVar41._0_8_ = 0xff800000ff800000;
            auVar41._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar41,
                               (undefined1  [16])terminated.field_0);
            iVar25 = 2;
          }
          auVar93 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar46 = ZEXT1664((undefined1  [16])vVar9.field_0);
          if (uVar26 < uVar23) goto LAB_00303e13;
        }
LAB_00304210:
      } while (iVar25 != 3);
LAB_0030441f:
      auVar41 = vandps_avx(auVar45,(undefined1  [16])terminated.field_0);
      auVar45._8_4_ = 0xff800000;
      auVar45._0_8_ = 0xff800000ff800000;
      auVar45._12_4_ = 0xff800000;
      auVar41 = vmaskmovps_avx(auVar41,auVar45);
      *(undefined1 (*) [16])(ray + 0x80) = auVar41;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }